

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O1

uint __thiscall FreeTypeFaceWrapper::GetFontFlags(FreeTypeFaceWrapper *this)

{
  bool bVar1;
  uint uVar2;
  char cVar3;
  bool bVar4;
  char cVar5;
  char cVar6;
  uint uVar8;
  double extraout_XMM0_Qa;
  int iVar7;
  
  if (this->mFace == (FT_Face)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (uint)this->mFace->face_flags >> 2 & 1;
  }
  if (this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) {
    cVar3 = '\0';
  }
  else {
    iVar7 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[8])();
    cVar3 = (char)iVar7;
  }
  bVar4 = IsDefiningCharsNotInAdobeStandardLatin(this);
  if (this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) {
    cVar5 = '\0';
  }
  else {
    iVar7 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[9])();
    cVar5 = (char)iVar7;
  }
  if (this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) {
    bVar1 = false;
  }
  else {
    (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[2])();
    bVar1 = extraout_XMM0_Qa != 0.0;
  }
  if (this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) {
    cVar6 = '\0';
  }
  else {
    iVar7 = (*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[10])();
    cVar6 = (char)iVar7;
  }
  uVar2 = uVar8 + 2;
  if (cVar3 == '\0') {
    uVar2 = uVar8;
  }
  iVar7 = 0x20;
  if (bVar4) {
    iVar7 = 4;
  }
  uVar8 = uVar2 + iVar7 + 8;
  if (cVar5 == '\0') {
    uVar8 = iVar7 + uVar2;
  }
  uVar2 = uVar8 + 0x40;
  if (!bVar1) {
    uVar2 = uVar8;
  }
  uVar8 = uVar2 | 0x40000;
  if (cVar6 == '\0') {
    uVar8 = uVar2;
  }
  return uVar8;
}

Assistant:

unsigned int FreeTypeFaceWrapper::GetFontFlags()
{
	unsigned int flags = 0;

	/* 
		flags are a combination of:
		
		1 - Fixed Pitch
		2 - Serif
		3 - Symbolic
		4 - Script
		6 - Nonsymbolic
		7 - Italic
		17 - AllCap
		18 - SmallCap
		19 - ForceBold

		not doing allcap,smallcap
	*/

	if(IsFixedPitch())
		flags |= 1;
	if(IsSerif())
		flags |= 2;
	if(IsSymbolic())
		flags |= 4;
	else
		flags |= 32;
	if(IsScript())
		flags |= 8;
	if(IsItalic())
		flags |= 64;
	if(IsForceBold())
		flags |= (1<<18);

	return flags;
}